

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_func.c
# Opt level: O0

GCfunc * lj_func_newC(lua_State *L,MSize nelems,GCtab *env)

{
  GCfunc *pGVar1;
  undefined8 in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  GCfunc *fn;
  undefined4 in_stack_fffffffffffffff0;
  
  pGVar1 = (GCfunc *)
           lj_mem_newgco((lua_State *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                         (GCSize)((ulong)in_RDX >> 0x20));
  (pGVar1->c).gct = '\b';
  (pGVar1->c).ffid = '\x01';
  (pGVar1->c).nupvalues = (uint8_t)in_ESI;
  (pGVar1->c).pc.ptr32 = *(int *)(in_RDI + 8) + 0x184;
  (pGVar1->c).env.gcptr32 = (uint32_t)in_RDX;
  return pGVar1;
}

Assistant:

GCfunc *lj_func_newC(lua_State *L, MSize nelems, GCtab *env)
{
  GCfunc *fn = (GCfunc *)lj_mem_newgco(L, sizeCfunc(nelems));
  fn->c.gct = ~LJ_TFUNC;
  fn->c.ffid = FF_C;
  fn->c.nupvalues = (uint8_t)nelems;
  /* NOBARRIER: The GCfunc is new (marked white). */
  setmref(fn->c.pc, &G(L)->bc_cfunc_ext);
  setgcref(fn->c.env, obj2gco(env));
  return fn;
}